

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O3

iterator __thiscall
eastl::
rbtree<char,_eastl::pair<const_char,_int>,_eastl::less<char>,_eastl::allocator,_eastl::use_first<eastl::pair<const_char,_int>_>,_true,_true>
::DoInsertValueImpl(rbtree<char,_eastl::pair<const_char,_int>,_eastl::less<char>,_eastl::allocator,_eastl::use_first<eastl::pair<const_char,_int>_>,_true,_true>
                    *this,node_type *pNodeParent,value_type *value,bool bForceToLeft)

{
  this_type **pNodeAnchor;
  rbtree_node_base *pNode;
  undefined7 in_register_00000009;
  RBTreeSide insertionSide;
  char in_R8B;
  
  pNodeAnchor = &(pNodeParent->super_rbtree_node_base).mpNodeLeft;
  insertionSide = kRBTreeSideLeft;
  if ((value_type *)pNodeAnchor != value && in_R8B == '\0') {
    insertionSide =
         (RBTreeSide)(value[4].first <= *(char *)CONCAT71(in_register_00000009,bForceToLeft));
  }
  pNode = (rbtree_node_base *)malloc(0x28);
  pNode[1].mpNodeRight = *(this_type **)CONCAT71(in_register_00000009,bForceToLeft);
  RBTreeInsert(pNode,(rbtree_node_base *)value,(rbtree_node_base *)pNodeAnchor,insertionSide);
  *(int *)&pNodeParent[1].super_rbtree_node_base.mpNodeRight =
       *(int *)&pNodeParent[1].super_rbtree_node_base.mpNodeRight + 1;
  *(rbtree_node_base **)this = pNode;
  return (iterator)(node_type *)this;
}

Assistant:

typename rbtree<K, V, C, A, E, bM, bU>::iterator
    rbtree<K, V, C, A, E, bM, bU>::DoInsertValueImpl(node_type* pNodeParent, const value_type& value, bool bForceToLeft)
    {
        RBTreeSide side;
        extract_key extractKey;

        // The reason we may want to have bForceToLeft == true is that pNodeParent->mValue and value may be equal.
        // In that case it doesn't matter what side we insert on, except that the C++ LWG #233 improvement report
        // suggests that we should use the insert hint position to force an ordering. So that's what we do.
        if(bForceToLeft || (pNodeParent == &mAnchor) || mCompare(extractKey(value), extractKey(pNodeParent->mValue)))
            side = kRBTreeSideLeft;
        else
            side = kRBTreeSideRight;

        node_type* const pNodeNew = DoCreateNode(value); // Note that pNodeNew->mpLeft, mpRight, mpParent, will be uninitialized.
        RBTreeInsert(pNodeNew, pNodeParent, &mAnchor, side);
        mnSize++;

        return iterator(pNodeNew);
    }